

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ising_model.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  long lVar5;
  uint s;
  parameter_type P;
  parameter_type P_00;
  parameter_type P_01;
  parameter_type P_02;
  parameter_type P_03;
  parameter_type P_04;
  parameter_type P_05;
  allocator aStack_10071;
  string generator;
  long lStack_10050;
  long lStack_10048;
  long lStack_10040;
  string arg;
  
  generator._M_dataplus._M_p = (pointer)&generator.field_2;
  generator._M_string_length = 0;
  generator.field_2._M_local_buf[0] = '\0';
  if (argc == 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Tina\'s Random Number Generator Library\n\n");
    poVar4 = std::operator<<(poVar4,"(P) & (C) by Heiko Bauke, 2000-2022\n\n");
    poVar4 = std::operator<<(poVar4,"two-domensional Ising model (Wolff algorithm)\n");
    poVar4 = std::operator<<(poVar4,"---------------------------------------------\n\n");
    poVar4 = std::operator<<(poVar4,"synopsis:\n");
    poVar4 = std::operator<<(poVar4,"$ ");
    poVar4 = std::operator<<(poVar4,*argv);
    poVar4 = std::operator<<(poVar4," --gen generator --runs runs --split split --size size\n");
    poVar4 = std::operator<<(poVar4,"try:\n");
    poVar4 = std::operator<<(poVar4,"$ ");
    poVar4 = std::operator<<(poVar4,*argv);
    std::operator<<(poVar4," --gen lcg64 --runs 100000 --split 1 --size 16\n");
LAB_0010323e:
    exit(1);
  }
  lVar5 = 2;
  lStack_10050 = 0;
  lStack_10048 = 0;
  lStack_10040 = 0;
  do {
    if ((long)argc <= lVar5 + -1) {
      P.b = 1;
      P.a = 0xfbd19fbbc5c07ff5;
      trng::lcg64::lcg64((lcg64 *)&arg,P);
      s = (uint)lStack_10048;
      trng::lcg64::split((lcg64 *)&arg,s,0);
      pcVar3 = trng::lcg64::name();
      bVar1 = std::operator==(&generator,pcVar3);
      if (bVar1) {
        wolff_main<trng::lcg64>((lcg64 *)&arg,lStack_10040,lStack_10048,lStack_10050);
      }
      trng::mrg2::mrg2((mrg2 *)&arg,(parameter_type)0x45335114595605e5);
      trng::mrg2::split((mrg2 *)&arg,s,0);
      pcVar3 = trng::mrg2::name();
      bVar1 = std::operator==(&generator,pcVar3);
      if (bVar1) {
        wolff_main<trng::mrg2>((mrg2 *)&arg,lStack_10040,lStack_10048,lStack_10050);
      }
      P_02.a[2] = 0x75e21f71;
      P_02.a[0] = 0x787c73e9;
      P_02.a[1] = 0x6ce5b0df;
      trng::mrg3::mrg3((mrg3 *)&arg,P_02);
      trng::mrg3::split((mrg3 *)&arg,s,0);
      pcVar3 = trng::mrg3::name();
      bVar1 = std::operator==(&generator,pcVar3);
      if (bVar1) {
        wolff_main<trng::mrg3>((mrg3 *)&arg,lStack_10040,lStack_10048,lStack_10050);
      }
      P_03.a[2] = 0x79883501;
      P_03.a[0] = 0x78b65021;
      P_03.a[1] = 0x4256534d;
      trng::mrg3s::mrg3s((mrg3s *)&arg,P_03);
      trng::mrg3s::split((mrg3s *)&arg,s,0);
      pcVar3 = trng::mrg3s::name();
      bVar1 = std::operator==(&generator,pcVar3);
      if (bVar1) {
        wolff_main<trng::mrg3s>((mrg3s *)&arg,lStack_10040,lStack_10048,lStack_10050);
      }
      P_00.a[2] = 0x44ddb3f9;
      P_00.a[3] = 0x6370d8d2;
      P_00.a[0] = 0x7753d502;
      P_00.a[1] = 0x542dbf61;
      trng::mrg4::mrg4((mrg4 *)&arg,P_00);
      trng::mrg4::split((mrg4 *)&arg,s,0);
      pcVar3 = trng::mrg4::name();
      bVar1 = std::operator==(&generator,pcVar3);
      if (bVar1) {
        wolff_main<trng::mrg4>((mrg4 *)&arg,lStack_10040,lStack_10048,lStack_10050);
      }
      trng::mrg5::mrg5((mrg5 *)&arg,(parameter_type *)trng::mrg5::LEcuyer1);
      trng::mrg5::split((mrg5 *)&arg,s,0);
      pcVar3 = trng::mrg5::name();
      bVar1 = std::operator==(&generator,pcVar3);
      if (bVar1) {
        wolff_main<trng::mrg5>((mrg5 *)&arg,lStack_10040,lStack_10048,lStack_10050);
      }
      trng::mrg5s::mrg5s((mrg5s *)&arg,(parameter_type *)trng::mrg5s::trng0);
      trng::mrg5s::split((mrg5s *)&arg,s,0);
      pcVar3 = trng::mrg5s::name();
      bVar1 = std::operator==(&generator,pcVar3);
      if (bVar1) {
        wolff_main<trng::mrg5s>((mrg5s *)&arg,lStack_10040,lStack_10048,lStack_10050);
      }
      trng::yarn2::yarn2((yarn2 *)&arg,trng::yarn2::LEcuyer1);
      trng::yarn2::split((yarn2 *)&arg,s,0);
      pcVar3 = trng::yarn2::name();
      bVar1 = std::operator==(&generator,pcVar3);
      if (bVar1) {
        wolff_main<trng::yarn2>((yarn2 *)&arg,lStack_10040,lStack_10048,lStack_10050);
      }
      P_04.a[2] = DAT_00178200;
      P_04.a[0] = (undefined4)trng::yarn3::LEcuyer1;
      P_04.a[1] = trng::yarn3::LEcuyer1._4_4_;
      trng::yarn3::yarn3((yarn3 *)&arg,P_04);
      trng::yarn3::split((yarn3 *)&arg,s,0);
      pcVar3 = trng::yarn3::name();
      bVar1 = std::operator==(&generator,pcVar3);
      if (bVar1) {
        wolff_main<trng::yarn3>((yarn3 *)&arg,lStack_10040,lStack_10048,lStack_10050);
      }
      P_05.a[2] = DAT_001d8228;
      P_05.a[0] = (undefined4)trng::yarn3s::trng0;
      P_05.a[1] = trng::yarn3s::trng0._4_4_;
      trng::yarn3s::yarn3s((yarn3s *)&arg,P_05);
      trng::yarn3s::split((yarn3s *)&arg,s,0);
      pcVar3 = trng::yarn3s::name();
      bVar1 = std::operator==(&generator,pcVar3);
      if (bVar1) {
        wolff_main<trng::yarn3s>((yarn3s *)&arg,lStack_10040,lStack_10048,lStack_10050);
      }
      P_01.a[2] = (undefined4)DAT_00238248;
      P_01.a[3] = DAT_00238248._4_4_;
      P_01.a[0] = (undefined4)trng::yarn4::LEcuyer1;
      P_01.a[1] = trng::yarn4::LEcuyer1._4_4_;
      trng::yarn4::yarn4((yarn4 *)&arg,P_01);
      trng::yarn4::split((yarn4 *)&arg,s,0);
      pcVar3 = trng::yarn4::name();
      bVar1 = std::operator==(&generator,pcVar3);
      if (bVar1) {
        wolff_main<trng::yarn4>((yarn4 *)&arg,lStack_10040,lStack_10048,lStack_10050);
      }
      trng::yarn5::yarn5((yarn5 *)&arg,(parameter_type *)trng::yarn5::LEcuyer1);
      trng::yarn5::split((yarn5 *)&arg,s,0);
      pcVar3 = trng::yarn5::name();
      bVar1 = std::operator==(&generator,pcVar3);
      if (bVar1) {
        wolff_main<trng::yarn5>((yarn5 *)&arg,lStack_10040,lStack_10048,lStack_10050);
      }
      trng::yarn5s::yarn5s((yarn5s *)&arg,(parameter_type *)trng::yarn5s::trng0);
      trng::yarn5s::split((yarn5s *)&arg,s,0);
      pcVar3 = trng::yarn5s::name();
      bVar1 = std::operator==(&generator,pcVar3);
      if (bVar1) {
        wolff_main<trng::yarn5s>((yarn5s *)&arg,lStack_10040,lStack_10048,lStack_10050);
      }
      trng::lagfib2xor<unsigned_int,_103U,_250U>::lagfib2xor
                ((lagfib2xor<unsigned_int,_103U,_250U> *)&arg);
      pcVar3 = trng::lagfib2xor<unsigned_int,_103U,_250U>::name();
      bVar1 = std::operator==(&generator,pcVar3);
      if (bVar1) {
        wolff_main<trng::lagfib2xor<unsigned_int,103u,250u>>
                  ((lagfib2xor<unsigned_int,_103U,_250U> *)&arg,lStack_10040,lStack_10048,
                   lStack_10050);
      }
      trng::lagfib4xor<unsigned_int,_471U,_1586U,_6988U,_9689U>::lagfib4xor
                ((lagfib4xor<unsigned_int,_471U,_1586U,_6988U,_9689U> *)&arg);
      pcVar3 = trng::lagfib4xor<unsigned_int,_471U,_1586U,_6988U,_9689U>::name();
      bVar1 = std::operator==(&generator,pcVar3);
      if (bVar1) {
        wolff_main<trng::lagfib4xor<unsigned_int,471u,1586u,6988u,9689u>>
                  ((lagfib4xor<unsigned_int,_471U,_1586U,_6988U,_9689U> *)&arg,lStack_10040,
                   lStack_10048,lStack_10050);
      }
      std::__cxx11::string::~string((string *)&generator);
      return 0;
    }
    std::__cxx11::string::string((string *)&arg,argv[lVar5 + -1],&aStack_10071);
    bVar1 = std::operator==(&arg,"--gen");
    iVar2 = (int)lVar5;
    if (bVar1) {
      if (argc <= iVar2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"missung argument for parameter ");
        poVar4 = std::operator<<(poVar4,(string *)&arg);
        std::operator<<(poVar4,'\n');
        goto LAB_0010323e;
      }
      std::__cxx11::string::assign((char *)&generator);
    }
    else {
      bVar1 = std::operator==(&arg,"--runs");
      if (bVar1) {
        if (argc <= iVar2) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"missung argument for parameter ");
          poVar4 = std::operator<<(poVar4,(string *)&arg);
          std::operator<<(poVar4,'\n');
          goto LAB_0010323e;
        }
        iVar2 = atoi(argv[lVar5]);
        lStack_10040 = (long)iVar2;
      }
      else {
        bVar1 = std::operator==(&arg,"--split");
        if (bVar1) {
          if (argc <= iVar2) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"missung argument for parameter ");
            poVar4 = std::operator<<(poVar4,(string *)&arg);
            std::operator<<(poVar4,'\n');
            goto LAB_0010323e;
          }
          iVar2 = atoi(argv[lVar5]);
          lStack_10048 = (long)iVar2;
        }
        else {
          bVar1 = std::operator==(&arg,"--size");
          if (!bVar1) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"unknown argument ");
            poVar4 = std::operator<<(poVar4,(string *)&arg);
            std::operator<<(poVar4,'\n');
            goto LAB_0010323e;
          }
          if (argc <= iVar2) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"missung argument for parameter ");
            poVar4 = std::operator<<(poVar4,(string *)&arg);
            std::operator<<(poVar4,'\n');
            goto LAB_0010323e;
          }
          iVar2 = atoi(argv[lVar5]);
          lStack_10050 = (long)iVar2;
        }
      }
    }
    std::__cxx11::string::~string((string *)&arg);
    lVar5 = lVar5 + 2;
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
  long runs{0}, split{0}, L{0};
  std::string generator;
  int argi{1};
  if (argc == 1) {
    std::cerr << "Tina's Random Number Generator Library\n\n"
              << "(P) & (C) by Heiko Bauke, 2000-2022\n\n"
              << "two-domensional Ising model (Wolff algorithm)\n"
              << "---------------------------------------------\n\n"
              << "synopsis:\n"
              << "$ " << argv[0] << " --gen generator --runs runs --split split --size size\n"
              << "try:\n"
              << "$ " << argv[0] << " --gen lcg64 --runs 100000 --split 1 --size 16\n";
    std::exit(EXIT_FAILURE);
  }
  while (argi < argc) {
    std::string arg(argv[argi]);
    if (arg == "--gen") {
      ++argi;
      if (argi < argc) {
        generator = argv[argi];
        ++argi;
      } else {
        std::cerr << "missung argument for parameter " << arg << '\n';
        std::exit(EXIT_FAILURE);
      }
    } else if (arg == "--runs") {
      ++argi;
      if (argi < argc) {
        runs = std::atoi(argv[argi]);
        ++argi;
      } else {
        std::cerr << "missung argument for parameter " << arg << '\n';
        std::exit(EXIT_FAILURE);
      }
    } else if (arg == "--split") {
      ++argi;
      if (argi < argc) {
        split = std::atoi(argv[argi]);
        ++argi;
      } else {
        std::cerr << "missung argument for parameter " << arg << '\n';
        std::exit(EXIT_FAILURE);
      }
    } else if (arg == "--size") {
      ++argi;
      if (argi < argc) {
        L = std::atoi(argv[argi]);
        ++argi;
      } else {
        std::cerr << "missung argument for parameter " << arg << '\n';
        std::exit(EXIT_FAILURE);
      }
    } else {
      std::cerr << "unknown argument " << arg << '\n';
      std::exit(EXIT_FAILURE);
    }
  }
  {
    trng::lcg64 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::mrg2 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::mrg3 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::mrg3s r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::mrg4 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::mrg5 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::mrg5s r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::yarn2 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::yarn3 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::yarn3s r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::yarn4 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::yarn5 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::yarn5s r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::r250_32 r;
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::Ziff_32 r;
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  return EXIT_SUCCESS;
}